

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O1

double load_param(char *param,double default_val,char *func)

{
  char *__nptr;
  double dVar1;
  char *numend;
  char *local_20;
  
  local_20 = (char *)0x0;
  __nptr = getenv(param);
  dVar1 = default_val;
  if (__nptr != (char *)0x0) {
    dVar1 = strtod(__nptr,&local_20);
  }
  if (((__nptr != (char *)0x0) && (local_20 == __nptr)) || (ABS(dVar1) == INFINITY)) {
    fprintf(_stderr,"%s: %s was not a finite positve floating point number. Using default: %g\n",
            default_val,func,param);
    dVar1 = default_val;
  }
  return dVar1;
}

Assistant:

static double load_param(const char * param, double default_val, 
        const char * func ) 
{
    double result = HUGE_VAL;
    char * numend = NULL;
#if HAS_DUPENV_S_WIN32
    char * str = NULL;
    if (_dupenv_s( &str, NULL , param ))
        return default_val;
#else
    char * str = getenv(param);
#endif
    
    result = str?strtod( str, &numend ):default_val;
    
    if ( (str && numend == str) || result == HUGE_VAL 
            || result == -HUGE_VAL ) {
        result = default_val;
        fprintf(stderr, "%s: %s was not a finite positve "
                        "floating point number."
                        " Using default: %g\n", 
                        func, param, result );
    }
#if HAS_DUPENV_S_WIN32
    free(str);
#endif
    return result;
}